

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

ssize_t __thiscall
xs::ExecuteBinaryMessage::write(ExecuteBinaryMessage *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  MessageWriter local_20;
  MessageWriter writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buf_local;
  ExecuteBinaryMessage *this_local;
  
  writer.m_buf = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_register_00000034,__fd);
  MessageWriter::MessageWriter(&local_20,(this->super_Message).type,writer.m_buf);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  MessageWriter::put<char_const*>(&local_20,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  MessageWriter::put<char_const*>(&local_20,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  MessageWriter::put<char_const*>(&local_20,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  MessageWriter::put<char_const*>(&local_20,pcVar1);
  MessageWriter::~MessageWriter(&local_20);
  return extraout_RAX;
}

Assistant:

void ExecuteBinaryMessage::write (vector<deUint8>& buf) const
{
	MessageWriter writer(type, buf);
	writer.put(name.c_str());
	writer.put(params.c_str());
	writer.put(workDir.c_str());
	writer.put(caseList.c_str());
}